

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O3

void ppu_tick(nes_system *system)

{
  uint16_t *puVar1;
  uint8_t *puVar2;
  undefined2 uVar3;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined8 uVar4;
  undefined2 uVar7;
  uint8_t uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  _func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *p_Var13;
  nes_cartridge *pnVar14;
  _func_void_nes_video_output_ptr_void_ptr *p_Var15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  uint8_t uVar22;
  byte bVar23;
  uint16_t uVar24;
  byte bVar25;
  uint uVar26;
  nes_ppu_render_mask nVar27;
  nes_system_state *state;
  long lVar28;
  uint uVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  short sVar33;
  ushort uVar34;
  ushort uVar35;
  uint32_t i;
  nes_ppu_render_mask nVar36;
  int iVar37;
  anon_union_2_2_2ecd3576_for_nes_ppu_12 aVar38;
  ushort uVar39;
  nes_ppu_render_mask nVar40;
  uint uVar41;
  uint uVar42;
  byte bVar43;
  ulong uVar44;
  uint uVar45;
  nes_video_output local_40;
  
  uVar8 = (system->state).ppu.reg_rw_mode;
  bVar43 = (system->state).ppu.field_0xa;
  if ((bVar43 & 0x18) != 0) {
    uVar34 = (system->state).ppu.vram_address;
    uVar45 = uVar34 & 0x3fff;
    uVar44 = (ulong)uVar45;
    uVar29 = (uint)uVar34;
    if ((bVar43 & 8) == 0) {
      p_Var13 = (system->config).memory_callback;
      if (p_Var13 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
      {
        (*p_Var13)(NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_WRITE,uVar34,&(system->state).ppu.vram_data,
                   (system->config).client_data);
      }
      if (uVar45 < 0x2000) {
        if (system->cartridge->chr_rom_size <= uVar44) {
          (system->state).chr_ram[uVar44] = (system->state).ppu.vram_data;
        }
      }
      else {
        uVar41 = uVar29 & 0xfff;
        if ((~uVar29 & 0x3f00) != 0) {
          uVar41 = uVar45 - 0x2000;
        }
        uVar44 = (ulong)uVar41;
        if ((uVar41 & 0xffff) < 0x1000) {
          uVar24 = (*system->cartridge->mapper->get_nametable_address)
                             (system->cartridge,(uint16_t)uVar41);
          uVar44 = (ulong)uVar24;
        }
        (system->state).vram[uVar44 & 0xffff] = (system->state).ppu.vram_data;
      }
    }
    else {
      pnVar14 = system->cartridge;
      if (uVar45 < 0x2000) {
        if (uVar44 < pnVar14->chr_rom_size) {
          uVar22 = (*pnVar14->mapper->read_chr)(pnVar14,(uint16_t)uVar45);
        }
        else {
          uVar22 = (system->state).chr_ram[uVar44];
        }
      }
      else {
        uVar29 = uVar29 & 0xfff;
        if ((~(uint)uVar34 & 0x3f00) != 0) {
          uVar29 = uVar45 - 0x2000;
        }
        uVar44 = (ulong)uVar29;
        if ((uVar29 & 0xffff) < 0x1000) {
          uVar24 = (*pnVar14->mapper->get_nametable_address)(pnVar14,(uint16_t)uVar29);
          uVar44 = (ulong)uVar24;
        }
        uVar22 = (system->state).vram[uVar44 & 0xffff];
      }
      (system->state).ppu.vram_data = uVar22;
      p_Var13 = (system->config).memory_callback;
      if (p_Var13 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
      {
        (*p_Var13)(NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_READ,(system->state).ppu.vram_address,
                   &(system->state).ppu.vram_data,(system->config).client_data);
      }
    }
  }
  nVar27 = (system->state).ppu.next_render_mask;
  uVar29 = (system->state).ppu.dot + 1;
  (system->state).ppu.dot = uVar29;
  if (0x154 < uVar29) {
    uVar11 = (system->state).ppu.scanline;
    (system->state).ppu.scanline = uVar11 + ((uVar11 + 1) / 0x106) * -0x106 + 1;
    (system->state).ppu.dot = 0;
    uVar29 = 0;
  }
  bVar43 = (system->state).ppu.status.b;
  if ((char)bVar43 < '\0') {
    bVar30 = (system->state).ppu.ctrl.b >> 2 & 0x20;
  }
  else {
    bVar30 = 0;
  }
  bVar31 = (system->state).ppu.field_0xa;
  bVar23 = bVar31 & 0xdf | bVar30;
  (system->state).ppu.field_0xa = bVar23;
  uVar45 = (system->state).ppu.scanline;
  if (uVar45 == 0x105) {
    if (uVar29 == 1) {
      bVar43 = bVar43 & 0x1f;
      (system->state).ppu.status.b = bVar43;
      (system->state).ppu.is_even_frame = (uint)((system->state).ppu.is_even_frame == 0);
      uVar4 = *(undefined8 *)(system->state).ppu.open_bus_decay_timer;
      bVar32 = (byte)uVar4;
      bVar25 = (byte)((ulong)uVar4 >> 8);
      bVar16 = (byte)((ulong)uVar4 >> 0x10);
      bVar17 = (byte)((ulong)uVar4 >> 0x18);
      bVar18 = (byte)((ulong)uVar4 >> 0x20);
      bVar19 = (byte)((ulong)uVar4 >> 0x28);
      bVar20 = (byte)((ulong)uVar4 >> 0x30);
      bVar21 = (byte)((ulong)uVar4 >> 0x38);
      *(ulong *)(system->state).ppu.open_bus_decay_timer =
           CONCAT17(bVar21 + 1,
                    CONCAT16(bVar20 + 1,
                             CONCAT15(bVar19 + 1,
                                      CONCAT14(bVar18 + 1,
                                               CONCAT13(bVar17 + 1,
                                                        CONCAT12(bVar16 + 1,
                                                                 CONCAT11(bVar25 + 1,bVar32 + 1)))))
                            ));
      puVar2 = &(system->state).ppu.open_bus;
      *puVar2 = *puVar2 & (~-((byte)(((byte)'$' < bVar21) * bVar21 | ((byte)'$' >= bVar21) * '$') ==
                             bVar21) & 0x80U |
                           ~-((byte)(((byte)'$' < bVar17) * bVar17 | ((byte)'$' >= bVar17) * '$') ==
                             bVar17) & 8U |
                           ~-((byte)(((byte)'$' < bVar19) * bVar19 | ((byte)'$' >= bVar19) * '$') ==
                             bVar19) & 0x20U |
                           ~-((byte)(((byte)'$' < bVar25) * bVar25 | ((byte)'$' >= bVar25) * '$') ==
                             bVar25) & 2U |
                          ~-((byte)(((byte)'$' < bVar20) * bVar20 | ((byte)'$' >= bVar20) * '$') ==
                            bVar20) & 0x40U |
                          ~-((byte)(((byte)'$' < bVar16) * bVar16 | ((byte)'$' >= bVar16) * '$') ==
                            bVar16) & 4U |
                          ~-((byte)(((byte)'$' < bVar18) * bVar18 | ((byte)'$' >= bVar18) * '$') ==
                            bVar18) & 0x10U |
                          ~-((byte)(((byte)'$' < bVar32) * bVar32 | ((byte)'$' >= bVar32) * '$') ==
                            bVar32) & 1U);
    }
  }
  else if (uVar45 == 0xf1) {
    if (uVar29 == 1) {
      bVar43 = bVar43 & 0x7f | (system->state).ppu.pre_vblank << 7;
      (system->state).ppu.status.b = bVar43;
    }
    else if (uVar29 == 0) {
      (system->state).ppu.pre_vblank = '\x01';
    }
  }
  if ((bVar31 & 0x18) != 0) {
    if ((0xef < uVar45 && uVar45 != 0x105) ||
       (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
      sVar33 = 0x20;
      if (((system->state).ppu.ctrl.b & 4) == 0) {
        sVar33 = 1;
      }
      puVar1 = &(system->state).ppu.vram_address;
      *puVar1 = *puVar1 + sVar33;
    }
    if ((system->state).ppu.update_cpu_read_buffer != 0) {
      (system->state).ppu.cpu_read_buffer = (system->state).ppu.vram_data;
      (system->state).ppu.update_cpu_read_buffer = 0;
    }
    bVar23 = bVar31 & 199 | bVar30;
    (system->state).ppu.field_0xa = bVar23;
  }
  uVar22 = (system->state).ppu.reg_rw_mode;
  if (uVar22 != '\0') {
    bVar30 = 0xff;
    if (uVar22 == '\x01') {
      (system->state).ppu.reg_data = (system->state).ppu.open_bus;
      bVar30 = 0;
    }
    switch(bVar23 & 7) {
    case 0:
      if (uVar22 == '\x02') {
        bVar31 = (system->state).ppu.reg_data;
        (system->state).ppu.ctrl.b = bVar31;
        (system->state).ppu.field_11.t_addr_reg =
             (system->state).ppu.field_11.t_addr_reg & 0xf3ff | (bVar31 & 3) << 10;
      }
      break;
    case 1:
      if (uVar22 == '\x02') {
        nVar27 = (nes_ppu_render_mask)(system->state).ppu.reg_data;
      }
      break;
    case 2:
      if (uVar22 != '\x01') break;
      bVar31 = (system->state).ppu.open_bus & 0x1f | bVar43 & 0xe0;
      (system->state).ppu.reg_data = bVar31;
      bVar43 = bVar43 & 0x7f;
      (system->state).ppu.status.b = bVar43;
      (system->state).ppu.write_toggle = 0;
      (system->state).ppu.pre_vblank = '\0';
      uVar41 = 0xe0;
      goto LAB_0010542e;
    case 3:
      if (uVar22 == '\x02') {
        (system->state).ppu.oam_address = (system->state).ppu.reg_data;
      }
      break;
    case 4:
      if (uVar22 != '\x02') {
        bVar31 = (system->state).ppu.sprite_shift_high
                 [(ulong)(system->state).ppu.oam_address + 0x25];
        (system->state).ppu.reg_data = bVar31;
        uVar41 = 0xff;
        goto LAB_0010542e;
      }
      bVar31 = (system->state).ppu.oam_address;
      bVar32 = (system->state).ppu.reg_data;
      bVar25 = bVar32 & 0xe3;
      if ((bVar31 & 3) != 2) {
        bVar25 = bVar32;
      }
      (system->state).ppu.sprite_shift_high[(ulong)bVar31 + 0x25] = bVar25;
      (system->state).ppu.oam_address = bVar31 + 1;
      break;
    case 5:
      if (uVar22 == '\x02') {
        iVar37 = (system->state).ppu.write_toggle;
        bVar31 = (system->state).ppu.reg_data;
        uVar39 = (ushort)(bVar31 >> 3);
        uVar35 = bVar31 & 7;
        uVar34 = (system->state).ppu.field_11.t_addr_reg;
        if (iVar37 == 0) {
          uVar39 = uVar39 | uVar34 & 0xffe0;
          (system->state).ppu.fine_x = (uint8_t)uVar35;
        }
        else {
          uVar39 = uVar35 << 0xc | uVar34 & 0x8c1f | uVar39 << 5;
        }
        (system->state).ppu.field_11.t_addr_reg = uVar39;
        (system->state).ppu.write_toggle = (uint)(iVar37 == 0);
      }
      break;
    case 6:
      if (uVar22 == '\x02') {
        iVar37 = (system->state).ppu.write_toggle;
        if (iVar37 == 0) {
          aVar38.t_addr_reg =
               (ushort)(byte)(system->state).ppu.vram_address |
               ((system->state).ppu.reg_data & 0x7f) << 8;
          lVar28 = 0x12;
        }
        else {
          aVar38.t_addr_reg._1_1_ = *(undefined1 *)((long)&(system->state).ppu.field_11 + 1);
          aVar38.t_addr_reg._0_1_ = (system->state).ppu.reg_data;
          (system->state).ppu.field_11 = aVar38;
          (system->state).ppu.field_10 = (anon_union_2_2_812c8e36_for_nes_ppu_10)aVar38;
          lVar28 = 0x5e;
        }
        *(anon_union_2_2_2ecd3576_for_nes_ppu_12 *)
         ((system->state).ppu.sprite_attributes + lVar28 + -0x24) = aVar38;
        (system->state).ppu.write_toggle = (uint)(iVar37 == 0);
      }
      break;
    case 7:
      uVar34 = (system->state).ppu.vram_address;
      if ((uVar34 & 0xff00) == 0x3f00) {
        uVar41 = 0x1f;
        if ((uVar34 & 0x13) == 0x10) {
          uVar41 = 0xc;
        }
        if (uVar22 == '\x02') {
          (system->state).ppu.palettes[uVar41 & uVar34] = (system->state).ppu.reg_data;
          if ((0xef < uVar45 && uVar45 != 0x105) ||
             (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
            uVar24 = uVar34 + 1;
            if (((system->state).ppu.ctrl.b & 4) != 0) {
              uVar24 = uVar34 + 0x20;
            }
            (system->state).ppu.vram_address = uVar24;
          }
        }
        else {
          bVar23 = bVar23 | 8;
          (system->state).ppu.field_0xa = bVar23;
          (system->state).ppu.reg_data =
               (system->state).ppu.open_bus & 0xc0 |
               (system->state).ppu.palettes[uVar41 & uVar34] & 0x3f;
          (system->state).ppu.update_cpu_read_buffer = 1;
          bVar30 = 0x3f;
        }
      }
      else if (uVar22 == '\x02') {
        bVar23 = bVar23 | 0x10;
        (system->state).ppu.field_0xa = bVar23;
        (system->state).ppu.vram_data = (system->state).ppu.reg_data;
      }
      else {
        bVar23 = bVar23 | 8;
        (system->state).ppu.field_0xa = bVar23;
        (system->state).ppu.reg_data = (system->state).ppu.cpu_read_buffer;
        (system->state).ppu.update_cpu_read_buffer = 1;
        bVar30 = 0xff;
      }
      if ((uVar45 < 0xf0 || uVar45 == 0x105) &&
         (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) != 0)) {
        uVar41 = *(uint *)&(system->state).ppu.field_10;
        if ((~uVar41 & 0x1f) == 0) {
          uVar41 = uVar41 & 0xffffffe0 ^ 0x400;
        }
        else {
          uVar41 = uVar41 & 0xffffffe0 | uVar41 + 1 & 0x1f;
        }
        uVar34 = (ushort)uVar41;
        (system->state).ppu.field_10.v_addr_reg = uVar34;
        if ((~uVar41 & 0x7000) == 0) {
          (system->state).ppu.field_10.v_addr_reg = uVar34 & 0x8fff;
          uVar41 = uVar41 >> 5 & 0x1f;
          if ((short)uVar41 == 0x1f) {
            uVar24 = uVar34 & 0x8c1f;
          }
          else {
            if (uVar41 != 0x1d) {
              uVar39 = uVar34 + 0x20 & 0x3e0;
              uVar34 = uVar34 & 0x8c1f;
              goto LAB_0010541b;
            }
            uVar24 = uVar34 & 0x8c1f ^ 0x800;
          }
        }
        else {
          uVar39 = uVar34 + 0x1000 & 0x7000;
          uVar34 = uVar34 & 0x8fff;
LAB_0010541b:
          uVar24 = uVar34 | uVar39;
        }
        (system->state).ppu.field_10.v_addr_reg = uVar24;
      }
    }
    if (bVar30 != 0) {
      bVar31 = (system->state).ppu.reg_data;
      uVar41 = (uint)bVar30;
LAB_0010542e:
      (system->state).ppu.open_bus = bVar31;
      lVar28 = 0;
      do {
        if ((uVar41 >> ((uint)lVar28 & 0x1f) & 1) != 0) {
          (system->state).ppu.open_bus_decay_timer[lVar28] = '\0';
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 8);
    }
    (system->state).ppu.reg_rw_mode = '\0';
  }
  nVar36 = (system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER;
  if (((nVar27 & NES_PPU_RENDER_MASK_RENDER) == 0) == (nVar36 != 0)) {
    nVar40 = nVar27 & ~NES_PPU_RENDER_MASK_RENDER | nVar36;
  }
  else {
    (system->state).ppu.next_render_mask = nVar27;
    nVar36 = nVar27 & NES_PPU_RENDER_MASK_RENDER;
    nVar40 = nVar27;
  }
  (system->state).ppu.render_mask = nVar40;
  if ((0xef < uVar45 && uVar45 != 0x105) || (nVar36 == 0)) goto LAB_00105ba2;
  bVar30 = (system->state).ppu.ctrl.b;
  iVar37 = 8 << (bVar30 >> 5 & 1);
  if (uVar29 < 0x102) {
    bVar31 = 1;
    if (((nVar40 & NES_PPU_RENDER_MASK_BACKGROUND) == 0) ||
       ((uVar29 < 10 && ((nVar40 & NES_PPU_RENDER_MASK_LEFTMOST_BACKGROUND) == 0)))) {
LAB_00105577:
      uVar41 = 0;
      bVar32 = 0;
    }
    else {
      uVar22 = (system->state).ppu.fine_x;
      uVar41 = (system->state).ppu.bg_shift_high >> (0xe - uVar22 & 0x1f) & 2 |
               (uint)(((system->state).ppu.bg_shift_low >> ((byte)(0xf - uVar22) & 0x1f) & 1) != 0);
      if (uVar41 == 0) goto LAB_00105577;
      uVar41 = (system->state).ppu.attr_shift_high >> (0xc - uVar22 & 0x1f) & 8 |
               (system->state).ppu.attr_shift_low >> (0xd - uVar22 & 0x1f) & 4 | uVar41;
      bVar32 = 1;
      bVar31 = 0;
    }
    uVar42 = uVar29 - 2;
    if (((nVar40 & NES_PPU_RENDER_MASK_SPRITES) != 0) &&
       ((9 < uVar29 || ((nVar40 & NES_PPU_RENDER_MASK_LEFTMOST_SPRITES) != 0)))) {
      lVar28 = 0;
      do {
        bVar25 = (system->state).ppu.sprite_x_positions[lVar28];
        if ((((int)(uint)bVar25 <= (int)uVar42) && ((int)uVar42 < (int)(bVar25 + 8))) &&
           (bVar25 = (bVar25 - (char)uVar29) + 1,
           uVar26 = (uint)(((system->state).ppu.sprite_shift_low[lVar28] >> (bVar25 & 7) & 1) != 0)
                    | (uint)((system->state).ppu.sprite_shift_high[lVar28] >> (bVar25 & 7)) * 2 & 2,
           uVar26 != 0)) {
          if (((lVar28 == 0) && ((system->state).ppu.sprite_0_test != '\0')) &&
             ((bVar43 & 0x40) == 0)) {
            bVar43 = (bVar32 & uVar42 != 0xff) << 6 | bVar43;
            (system->state).ppu.status.b = bVar43;
          }
          bVar32 = (system->state).ppu.sprite_attributes[lVar28].b;
          if ((bool)(bVar31 | (bVar32 & 0x20) == 0)) {
            uVar41 = uVar26 + (bVar32 & 3) * 4 + 0x10;
          }
          break;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 8);
    }
    bVar31 = (system->state).ppu.palettes[uVar41];
    bVar32 = bVar31 & 0x30;
    if ((nVar40 & NES_PPU_RENDER_MASK_GRAYSCALE) == 0) {
      bVar32 = bVar31;
    }
    (system->state).ppu.color_out = bVar32;
    if (uVar29 - 0x142 < 0x10 || uVar42 < 0x100) goto LAB_00105697;
    if (uVar29 != 0) goto LAB_001056af;
switchD_00105795_caseD_3:
    if (uVar45 == 0x105) {
      if (uVar29 - 0x118 < 0x19) {
        uVar10 = (system->state).ppu.field_10;
        (system->state).ppu.field_10.v_addr_reg =
             (system->state).ppu.field_11.t_addr_reg & 0x7be0 | uVar10 & 0x841f;
      }
      else if ((uVar29 == 0x153) && ((system->state).ppu.is_even_frame == 0)) {
        (system->state).ppu.dot = 0x154;
      }
    }
    goto LAB_00105ba2;
  }
  (system->state).ppu.color_out = '\x0f';
  if (uVar29 - 0x142 < 0x10) {
LAB_00105697:
    uVar3 = (system->state).ppu.bg_shift_low;
    uVar5 = (system->state).ppu.bg_shift_high;
    uVar6 = (system->state).ppu.attr_shift_low;
    uVar7 = (system->state).ppu.attr_shift_high;
    (system->state).ppu.bg_shift_low = uVar3 * 2;
    (system->state).ppu.bg_shift_high = uVar5 * 2;
    (system->state).ppu.attr_shift_low = uVar6 * 2;
    (system->state).ppu.attr_shift_high = uVar7 * 2;
  }
LAB_001056af:
  if (0x100 < uVar29 && 0xf < uVar29 - 0x141) {
    if (uVar29 == 0x101) {
      uVar9 = (system->state).ppu.field_10;
      (system->state).ppu.field_10.v_addr_reg =
           (system->state).ppu.field_11.t_addr_reg & 0x41f | uVar9 & 0xfbe0;
    }
    if ((uVar29 - 1 < 0x140) && ((nVar40 & NES_PPU_RENDER_MASK_SPRITES) != 0)) {
      uVar41 = uVar29 - 0x101 >> 3;
      uVar44 = (ulong)uVar41;
      bVar43 = (system->state).ppu.eval_oam_byte_count;
      bVar31 = (system->state).ppu.palettes[uVar44 * 4 + -0x20];
      bVar32 = (system->state).ppu.palettes[uVar44 * 4 + -0x1f];
      bVar25 = (system->state).ppu.palettes[uVar44 * 4 + -0x1e];
      uVar22 = (system->state).ppu.palettes[uVar44 * 4 + -0x1d];
      (system->state).ppu.oam_address = '\0';
      (system->state).ppu.sprite_0_test = (system->state).ppu.eval_oam_has_sprite_zero;
      sVar33 = (short)iVar37;
      switch(uVar29 & 7) {
      case 0:
        bVar30 = (system->state).ppu.vram_data;
        if ((bVar25 & 0x40) != 0) {
          bVar30 = (byte)(((ulong)bVar30 * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20);
        }
        (system->state).ppu.sprite_shift_high[uVar44] = bVar30;
        if (bVar43 >> 2 <= uVar41) {
          (system->state).ppu.sprite_shift_high[uVar44] = '\0';
          (system->state).ppu.sprite_shift_low[uVar44] = '\0';
        }
        break;
      case 1:
        (system->state).ppu.sprite_attributes[uVar44].b = bVar25;
        break;
      case 2:
        (system->state).ppu.sprite_x_positions[uVar44] = uVar22;
        break;
      case 5:
        uVar34 = (ushort)bVar32 << 4 & 0xffe0;
        if ((bVar30 & 0x20) == 0) {
          uVar34 = (ushort)bVar32 << 4;
          bVar32 = bVar30 >> 3;
        }
        uVar35 = (short)uVar45 - (ushort)bVar31;
        uVar39 = sVar33 + ~uVar35;
        if (-1 < (char)bVar25) {
          uVar39 = uVar35;
        }
        (system->state).ppu.field_0xa = bVar23 | 8;
        (system->state).ppu.vram_address =
             (ushort)(bVar32 & 1) << 0xc | uVar34 | (uVar39 & 8) + uVar39;
        break;
      case 6:
        bVar43 = (system->state).ppu.vram_data;
        if ((bVar25 & 0x40) == 0) {
          (system->state).ppu.sprite_shift_low[uVar44] = bVar43;
        }
        else {
          (system->state).ppu.sprite_shift_low[uVar44] =
               (uint8_t)(((ulong)bVar43 * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20);
        }
        break;
      case 7:
        uVar34 = (ushort)bVar32 << 4 & 0xffe0;
        if ((bVar30 & 0x20) == 0) {
          uVar34 = (ushort)bVar32 << 4;
          bVar32 = bVar30 >> 3;
        }
        uVar35 = (short)uVar45 - (ushort)bVar31;
        uVar39 = sVar33 + ~uVar35;
        if (-1 < (char)bVar25) {
          uVar39 = uVar35;
        }
        (system->state).ppu.field_0xa = bVar23 | 8;
        (system->state).ppu.vram_address =
             (uVar39 & 8) + uVar39 + 8 | (ushort)(bVar32 & 1) << 0xc | uVar34;
      }
    }
    goto switchD_00105795_caseD_3;
  }
  switch(uVar29 & 7) {
  case 0:
    uVar41 = *(uint *)&(system->state).ppu.field_10;
    if ((~uVar41 & 0x1f) == 0) {
      uVar41 = uVar41 & 0xffffffe0 ^ 0x400;
    }
    else {
      uVar41 = uVar41 & 0xffffffe0 | uVar41 + 1 & 0x1f;
    }
    uVar34 = (ushort)uVar41;
    (system->state).ppu.field_10.v_addr_reg = uVar34;
    if (uVar29 == 1) goto LAB_0010591e;
    if (uVar29 != 0x100) goto LAB_00105a92;
    if ((~uVar41 & 0x7000) == 0) {
      uVar41 = uVar41 >> 5 & 0x1f;
      if ((short)uVar41 == 0x1f) {
        uVar34 = uVar34 & 0x8c1f;
      }
      else {
        if (uVar41 != 0x1d) {
          uVar39 = uVar34 + 0x20 & 0x3e0;
          uVar34 = uVar34 & 0x8c1f;
          goto LAB_00105b67;
        }
        uVar34 = uVar34 & 0x8c1f ^ 0x800;
      }
    }
    else {
      uVar39 = uVar34 + 0x1000 & 0x7000;
      uVar34 = uVar34 & 0x8fff;
LAB_00105b67:
      uVar34 = uVar34 | uVar39;
    }
    (system->state).ppu.field_10.v_addr_reg = uVar34;
    goto LAB_00105b6d;
  case 1:
    bVar30 = (system->state).ppu.palette_attribute;
    uVar44._0_2_ = (system->state).ppu.bg_shift_low;
    uVar44._2_2_ = (system->state).ppu.bg_shift_high;
    uVar44._4_2_ = (system->state).ppu.attr_shift_low;
    uVar44._6_2_ = (system->state).ppu.attr_shift_high;
    uVar44 = (ulong)CONCAT14(-(bVar30 & 1),
                             (uint)(system->state).ppu.vram_data << 0x10 |
                             (uint)(system->state).ppu.bitplane_slice_low) |
             (ulong)(byte)((char)(bVar30 << 6) >> 7) << 0x30 | uVar44;
    (system->state).ppu.bg_shift_low = (short)uVar44;
    (system->state).ppu.bg_shift_high = (short)(uVar44 >> 0x10);
    (system->state).ppu.attr_shift_low = (short)(uVar44 >> 0x20);
    (system->state).ppu.attr_shift_high = (short)(uVar44 >> 0x30);
    (system->state).ppu.field_0xa = bVar23 | 8;
    uVar34 = (system->state).ppu.field_10.v_addr_reg & 0xfff | 0x2000;
    break;
  case 2:
    (system->state).ppu.tile_value = (system->state).ppu.vram_data;
    goto LAB_00105915;
  case 3:
    (system->state).ppu.field_0xa = bVar23 | 8;
    uVar34 = (system->state).ppu.field_10.v_addr_reg;
    uVar34 = (uVar34 >> 2 & 7) + (uVar34 >> 4 & 0x38 | uVar34 & 0xc00) + 0x23c0;
    break;
  case 4:
    bVar30 = (system->state).ppu.vram_data;
    (system->state).ppu.palette_attribute = bVar30;
    uVar34 = (system->state).ppu.field_10.v_addr_reg;
    bVar31 = (byte)uVar34;
    if ((uVar34 & 0x42) != 0) {
      (system->state).ppu.palette_attribute = (bVar30 >> (bVar31 >> 4 & 4)) >> (bVar31 & 2);
    }
    goto LAB_00105915;
  case 5:
    (system->state).ppu.field_0xa = bVar23 | 8;
    uVar34 = (system->state).ppu.field_10.v_addr_reg >> 0xc & 7 |
             (ushort)(system->state).ppu.tile_value << 4 | (bVar30 & 0x10) << 8;
    break;
  case 6:
    (system->state).ppu.bitplane_slice_low = (system->state).ppu.vram_data;
    goto LAB_00105915;
  case 7:
    (system->state).ppu.field_0xa = bVar23 | 8;
    uVar34 = (system->state).ppu.field_10.v_addr_reg >> 0xc |
             (ushort)(system->state).ppu.tile_value << 4 | (ushort)(bVar30 >> 4 & 1) << 0xc | 8;
  }
  (system->state).ppu.vram_address = uVar34;
LAB_00105915:
  if (uVar29 == 1) {
LAB_0010591e:
    (system->state).ppu.eval_oam_has_sprite_zero = '\0';
    (system->state).ppu.eval_oam_byte_count = '\0';
    (system->state).ppu.eval_oam_src_addr = '\0';
LAB_00105928:
    (system->state).ppu.palettes[(ulong)(uVar29 - 1 >> 1) - 0x20] = 0xff;
    goto LAB_00105ba2;
  }
LAB_00105a92:
  if (0x100 < uVar29) goto LAB_00105ba2;
  if (uVar29 < 0x41) goto LAB_00105928;
  if ((uVar29 & 1) != 0) {
    (system->state).ppu.eval_oam_entry_data =
         (system->state).ppu.sprite_shift_high[(ulong)(system->state).ppu.oam_address + 0x25];
    goto LAB_00105ba2;
  }
LAB_00105b6d:
  bVar30 = (system->state).ppu.oam_address;
  if (bVar30 < (system->state).ppu.eval_oam_src_addr) goto LAB_00105ba2;
  (system->state).ppu.eval_oam_src_addr = bVar30;
  bVar31 = (system->state).ppu.eval_oam_byte_count;
  if ((bVar31 & 3) == 0) {
    bVar23 = (system->state).ppu.eval_oam_entry_data;
    if (((bVar23 < 0xf0) && (bVar23 <= uVar45)) && (uVar45 < iVar37 + (uint)bVar23)) {
      if (uVar29 == 0x42) {
        (system->state).ppu.eval_oam_has_sprite_zero = '\x01';
      }
      if (bVar31 != 0x20) goto LAB_00105b85;
      (system->state).ppu.status.b = bVar43 | 0x20;
      goto LAB_00105b9d;
    }
    (system->state).ppu.oam_address = bVar30 + 4;
    if (bVar31 != 0x20) goto LAB_00105ba2;
    bVar30 = bVar30 + 1 & 3 | bVar30 + 4 & 0xfc;
  }
  else {
LAB_00105b85:
    if (bVar31 < 0x20) {
      uVar22 = (system->state).ppu.eval_oam_entry_data;
      (system->state).ppu.eval_oam_byte_count = bVar31 + 1;
      (system->state).ppu.palettes[(ulong)bVar31 - 0x20] = uVar22;
    }
LAB_00105b9d:
    bVar30 = bVar30 + 1;
  }
  (system->state).ppu.oam_address = bVar30;
LAB_00105ba2:
  (system->state).ppu.render_mask = (system->state).ppu.next_render_mask;
  (system->state).ppu.next_render_mask = nVar27;
  if (((uVar8 == '\x01') && ((system->state).cpu.rw_mode == '\x01')) &&
     (uVar34 = (system->state).cpu.address, (uVar34 & 0xe000) == 0x2000)) {
    uVar8 = (system->state).ppu.reg_data;
    (system->state).cpu.data = uVar8;
    (system->state).cached_ppu_reg[uVar34 & 7] = uVar8;
    p_Var13 = (system->config).memory_callback;
    if ((p_Var13 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
       && ((*p_Var13)(NES_MEMORY_TYPE_CPU,NES_MEMORY_OP_READ,uVar34,&(system->state).cpu.data,
                      (system->config).client_data), (char)(uVar34 & 7) == '\x04')) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_OAM,NES_MEMORY_OP_READ,(ushort)(system->state).ppu.oam_address,
                 &(system->state).ppu.reg_data,(system->config).client_data);
    }
  }
  uVar11 = (system->state).ppu.dot;
  uVar12 = (system->state).ppu.scanline;
  system->framebuffer[uVar12 * 0x155 + uVar11] = (system->state).ppu.color_out;
  if (((uVar11 == 0) && (uVar12 == 0xf1)) &&
     (p_Var15 = (system->config).video_callback,
     p_Var15 != (_func_void_nes_video_output_ptr_void_ptr *)0x0)) {
    local_40.framebuffer = (nes_pixel *)(system->framebuffer + 0xaaa);
    local_40.width = 0x100;
    local_40.height = 0xe0;
    local_40._12_1_ = (system->state).ppu.is_even_frame == 0;
    (*p_Var15)(&local_40,(system->config).client_data);
  }
  return;
}

Assistant:

static void ppu_tick(nes_system* system)
{
    nes_system_state* state = &system->state;

    int is_reg_read = (state->ppu.reg_rw_mode == NES_PPU_REG_RW_MODE_READ);

    if (state->ppu.r | state->ppu.w)
        ppu_mem_rw(system);

    nes_ppu_execute(&state->ppu);

    if (is_reg_read)
        ppu_cpu_bus(system);
    
    system->framebuffer[state->ppu.scanline * SCANLINE_WIDTH + state->ppu.dot] = state->ppu.color_out;
   
    if (system->config.video_callback && state->ppu.scanline == (RENDER_END_SCANLINE + 1) && state->ppu.dot == 0)
    {
        nes_video_output video_output;
        video_output.framebuffer = (nes_pixel*)(system->framebuffer + 2 + (NES_FRAMEBUFFER_ROW_STRIDE * 8));
        video_output.width  = 256;
        video_output.height = 224;
        video_output.odd_frame = !state->ppu.is_even_frame;
        video_output.emphasize_red      = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_RED;
        video_output.emphasize_green    = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_GREEN;
        video_output.emphasize_blue     = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_BLUE;

        system->config.video_callback(&video_output, system->config.client_data);
    }
}